

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListView::dropEvent(QListView *this,QDropEvent *event)

{
  QPersistentModelIndex *pQVar1;
  long *plVar2;
  int *piVar3;
  char cVar4;
  bool bVar5;
  DragDropMode DVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  QListView *pQVar10;
  iterator iVar11;
  iterator iVar12;
  ulong uVar13;
  QAbstractItemModel *pQVar14;
  QModelIndex *index;
  QModelIndex *pQVar15;
  QPersistentModelIndex *pQVar16;
  long lVar17;
  long in_FS_OFFSET;
  bool bVar18;
  QPersistentModelIndex dropRow;
  int row;
  int col;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  QModelIndex local_b8;
  QPersistentModelIndex local_a0;
  QArrayDataPointer<QPersistentModelIndex> local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  int local_58;
  undefined4 local_54;
  undefined8 local_50;
  quintptr local_48;
  QAbstractItemModel *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
  if (*(int *)(event + 0x2c) == 2) {
    bVar18 = false;
  }
  else {
    DVar6 = QAbstractItemView::dragDropMode((QAbstractItemView *)this);
    bVar18 = DVar6 != InternalMove;
  }
  pQVar10 = (QListView *)QDropEvent::source();
  if ((!bVar18) && (pQVar10 == this)) {
    local_50 = -1;
    local_48 = 0;
    pQStack_40 = (QAbstractItemModel *)0x0;
    local_54 = 0xffffffff;
    local_58 = -1;
    if ((event[0xc] == (QDropEvent)0x0) &&
       (cVar4 = (**(code **)(*plVar2 + 0x110))(plVar2,event,&local_58,&local_54,&local_50),
       cVar4 != '\0')) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = 0xaaaaaaaa;
      uStack_74 = 0xaaaaaaaa;
      uStack_70 = 0xaaaaaaaa;
      uStack_6c = 0xaaaaaaaa;
      (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                             super_QWidget + 0x2d8))(&local_78,this);
      local_98.d = (Data *)0x0;
      local_98.ptr = (QPersistentModelIndex *)0x0;
      local_98.size = 0;
      QList<QPersistentModelIndex>::reserve
                ((QList<QPersistentModelIndex> *)&local_98,(qsizetype)local_68);
      if (local_68 == (undefined1 *)0x0) {
      }
      else {
        pQVar15 = (QModelIndex *)CONCAT44(uStack_6c,uStack_70);
        lVar17 = (long)local_68 * 0x18;
        do {
          QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_b8,pQVar15);
          QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                    ((QMovableArrayOps<QPersistentModelIndex> *)&local_98,local_98.size,
                     (QPersistentModelIndex *)&local_b8);
          QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8);
          if ((((pQVar15->r == (int)local_50) && (pQVar15->c == local_50._4_4_)) &&
              (pQVar15->i == local_48)) && ((pQVar15->m).ptr == pQStack_40)) goto LAB_0056ac80;
          pQVar15 = pQVar15 + 1;
          lVar17 = lVar17 + -0x18;
        } while (lVar17 != 0);
      }
      if ((((int)local_50 < 0) || (local_50 < 0)) || (pQStack_40 == (QAbstractItemModel *)0x0)) {
        iVar11 = QList<QPersistentModelIndex>::begin((QList<QPersistentModelIndex> *)&local_98);
        iVar12 = QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_98);
        if (iVar11.i != iVar12.i) {
          uVar13 = (long)iVar12.i - (long)iVar11.i >> 3;
          lVar17 = 0x3f;
          if (uVar13 != 0) {
            for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          std::
          __introsort_loop<QList<QPersistentModelIndex>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
                    (iVar11.i,iVar12.i,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<QList<QPersistentModelIndex>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
                    (iVar11.i,iVar12.i);
        }
        local_a0.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar14 = QAbstractItemView::model((QAbstractItemView *)this);
        (**(code **)(*(long *)pQVar14 + 0x60))(&local_b8,pQVar14,local_58,local_54,&local_50);
        QPersistentModelIndex::QPersistentModelIndex(&local_a0,&local_b8);
        if (local_58 == -1) {
          pQVar14 = QAbstractItemView::model((QAbstractItemView *)this);
          local_b8.r = -1;
          local_b8.c = -1;
          local_b8.i = 0;
          local_b8.m.ptr = (QAbstractItemModel *)0x0;
          iVar8 = (**(code **)(*(long *)pQVar14 + 0x78))(pQVar14);
        }
        else {
          iVar7 = QPersistentModelIndex::row();
          iVar8 = local_58;
          if (-1 < iVar7) {
            iVar8 = QPersistentModelIndex::row();
          }
        }
        if (local_98.size != 0) {
          pQVar1 = local_98.ptr + local_98.size;
          bVar5 = false;
          pQVar16 = local_98.ptr;
LAB_0056abcd:
          do {
            iVar7 = QPersistentModelIndex::row();
            if ((iVar8 != iVar7) && (iVar7 = QPersistentModelIndex::row(), iVar8 != iVar7 + 1)) {
              pQVar14 = QAbstractItemView::model((QAbstractItemView *)this);
              local_b8.r = -1;
              local_b8.c = -1;
              local_b8.i = 0;
              local_b8.m.ptr = (QAbstractItemModel *)0x0;
              uVar9 = QPersistentModelIndex::row();
              local_d0 = 0xffffffffffffffff;
              local_c8 = 0;
              uStack_c0 = 0;
              cVar4 = (**(code **)(*(long *)pQVar14 + 0x118))
                                (pQVar14,&local_b8,uVar9,1,&local_d0,iVar8);
              if (cVar4 == '\0') {
                pQVar16 = pQVar16 + 1;
                if (pQVar16 == pQVar1) {
                  if (!bVar5) goto LAB_0056ac76;
                  break;
                }
                goto LAB_0056abcd;
              }
            }
            iVar8 = QPersistentModelIndex::row();
            iVar8 = iVar8 + 1;
            pQVar16 = pQVar16 + 1;
            bVar5 = true;
          } while (pQVar16 != pQVar1);
          event[0xc] = (QDropEvent)0x1;
        }
LAB_0056ac76:
        QPersistentModelIndex::~QPersistentModelIndex(&local_a0);
      }
LAB_0056ac80:
      QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_98);
      piVar3 = (int *)CONCAT44(uStack_74,local_78);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),0x18,0x10);
        }
      }
    }
    if (event[0xc] == (QDropEvent)0x1) {
      *(undefined1 *)((long)plVar2 + 0x3e5) = 1;
    }
  }
  cVar4 = (**(code **)(*(long *)plVar2[0xa8] + 0xb8))((long *)plVar2[0xa8],event);
  if ((cVar4 == '\0') || ((*(byte *)((long)plVar2 + 0x3e5) & 1) == 0)) {
    if (!bVar18 && (*(byte *)((long)plVar2 + 0x3e5) & 1) == 0) {
      event[0xc] = (QDropEvent)0x0;
    }
    QAbstractItemView::dropEvent((QAbstractItemView *)this,event);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::dropEvent(QDropEvent *event)
{
    Q_D(QListView);

    const bool moveAction = event->dropAction() == Qt::MoveAction
                         || dragDropMode() == QAbstractItemView::InternalMove;
    if (event->source() == this && moveAction) {
        QModelIndex topIndex;
        bool topIndexDropped = false;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex)) {
            const QList<QModelIndex> selIndexes = selectedIndexes();
            QList<QPersistentModelIndex> persIndexes;
            persIndexes.reserve(selIndexes.size());

            for (const auto &index : selIndexes) {
                persIndexes.append(index);
                if (index == topIndex) {
                    topIndexDropped = true;
                    break;
                }
            }

            if (!topIndexDropped && !topIndex.isValid()) {
                std::sort(persIndexes.begin(), persIndexes.end()); // The dropped items will remain in the same visual order.

                QPersistentModelIndex dropRow = model()->index(row, col, topIndex);

                int r = row == -1 ? model()->rowCount() : (dropRow.row() >= 0 ? dropRow.row() : row);
                bool dataMoved = false;
                for (const QPersistentModelIndex &pIndex : std::as_const(persIndexes)) {
                    // only generate a move when not same row or behind itself
                    if (r != pIndex.row() && r != pIndex.row() + 1) {
                        // try to move (preserves selection)
                        const bool moved = model()->moveRow(QModelIndex(), pIndex.row(), QModelIndex(), r);
                        if (!moved)
                            continue; // maybe it'll work for other rows
                        dataMoved = true; // success
                    } else {
                        // move onto itself is blocked, don't delete anything
                        dataMoved = true;
                    }
                    r = pIndex.row() + 1;   // Dropped items are inserted contiguously and in the right order.
                }
                if (dataMoved)
                    event->accept();
            }
        }

        // either we or a subclass accepted the move event, so assume that the data was
        // moved and that QAbstractItemView shouldn't remove the source when QDrag::exec returns
        if (event->isAccepted())
            d->dropEventMoved = true;
    }

    if (!d->commonListView->filterDropEvent(event) || !d->dropEventMoved) {
        // icon view didn't move the data, and moveRows not implemented, so fall back to default
        if (!d->dropEventMoved && moveAction)
            event->ignore();
        QAbstractItemView::dropEvent(event);
    }
}